

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

bool __thiscall re2::Regexp::ParseState::DoLeftParen(ParseState *this,StringPiece *name)

{
  int iVar1;
  Regexp *this_00;
  string *__return_storage_ptr__;
  
  this_00 = (Regexp *)operator_new(0x28);
  Regexp(this_00,kRegexpCharClass|kRegexpEmptyMatch,this->flags_);
  iVar1 = this->ncap_ + 1;
  this->ncap_ = iVar1;
  (this_00->field_7).field_0.max_ = iVar1;
  if (name->ptr_ != (char *)0x0) {
    __return_storage_ptr__ = (string *)operator_new(0x20);
    StringPiece::as_string_abi_cxx11_(__return_storage_ptr__,name);
    (this_00->field_7).field_1.name_ = __return_storage_ptr__;
  }
  PushRegexp(this,this_00);
  return true;
}

Assistant:

bool Regexp::ParseState::DoLeftParen(const StringPiece& name) {
  Regexp* re = new Regexp(kLeftParen, flags_);
  re->cap_ = ++ncap_;
  if (name.data() != NULL)
    re->name_ = new string(name.as_string());
  return PushRegexp(re);
}